

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  bool bVar1;
  char *pcVar2;
  reference ppcVar3;
  string *psVar4;
  pointer ppVar5;
  size_type sVar6;
  ulong uVar7;
  ostream *poVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar9;
  allocator local_3a1;
  string local_3a0;
  string local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320 [8];
  string makefileName;
  value_type local_2e0;
  size_type local_2c0;
  size_type start;
  undefined1 local_298 [8];
  string workString;
  char *regexString;
  RegularExpression flagRegex;
  string definesString;
  string flagsString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  _Base_ptr local_f8;
  undefined1 local_f0;
  _Self local_e8;
  _Self local_e0;
  iterator sourceFileFlagsIter;
  cmSourceFile *sourceFile;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_c8;
  const_iterator iter;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_b8;
  const_iterator sourceFilesEnd;
  allocator local_99;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  bool firstTarget_local;
  char *make_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  string *targetName_local;
  cmGeneratedFileStream *fout_local;
  cmExtraSublimeTextGenerator *this_local;
  
  sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = firstTarget;
  if (target != (cmGeneratorTarget *)0x0) {
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"CMAKE_BUILD_TYPE",&local_99);
    pcVar2 = cmMakefile::GetSafeDefinition(makefile,&local_98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,pcVar2,(allocator *)((long)&sourceFilesEnd._M_current + 3));
    cmGeneratorTarget::GetSourceFiles
              (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58,&local_78)
    ;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sourceFilesEnd._M_current + 3));
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    iter._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
    ::__normal_iterator<cmSourceFile**>
              ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                *)&local_b8,
               (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                *)&iter);
    sourceFile = (cmSourceFile *)
                 std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                           ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
    ::__normal_iterator<cmSourceFile**>
              ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                *)&local_c8,
               (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                *)&sourceFile);
    while (bVar1 = __gnu_cxx::operator!=(&local_c8,&local_b8), bVar1) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_c8);
      sourceFileFlagsIter._M_node = (_Base_ptr)*ppcVar3;
      psVar4 = cmSourceFile::GetFullPath((cmSourceFile *)sourceFileFlagsIter._M_node,(string *)0x0);
      local_e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find(sourceFileFlags,psVar4);
      local_e8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end(sourceFileFlags);
      bVar1 = std::operator==(&local_e0,&local_e8);
      if (bVar1) {
        psVar4 = cmSourceFile::GetFullPath
                           ((cmSourceFile *)sourceFileFlagsIter._M_node,(string *)0x0);
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_148);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::
        pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                  (&local_130,psVar4,&local_148);
        pVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::insert(sourceFileFlags,&local_130);
        local_f8 = (_Base_ptr)pVar9.first._M_node;
        local_f0 = pVar9.second;
        local_e0._M_node = local_f8;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~pair(&local_130);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_148);
      }
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_e0);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_c8);
      ComputeFlagsForObject_abi_cxx11_
                ((string *)((long)&definesString.field_2 + 8),this,*ppcVar3,lg,target);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_c8);
      ComputeDefines_abi_cxx11_((string *)&flagRegex.searchstring,this,*ppcVar3,lg,target);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&ppVar5->second);
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&regexString);
      workString.field_2._8_8_ = anon_var_dwarf_449e7d;
      cmsys::RegularExpression::compile
                ((RegularExpression *)&regexString,
                 "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&definesString.field_2 + 8)," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &flagRegex.searchstring);
      std::__cxx11::string::~string((string *)&start);
      while (bVar1 = cmsys::RegularExpression::find
                               ((RegularExpression *)&regexString,(string *)local_298), bVar1) {
        local_2c0 = cmsys::RegularExpression::start((RegularExpression *)&regexString);
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_298);
        if (*pcVar2 == ' ') {
          local_2c0 = local_2c0 + 1;
        }
        cmsys::RegularExpression::end((RegularExpression *)&regexString);
        std::__cxx11::string::substr((ulong)&local_2e0,(ulong)local_298);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ppVar5->second,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        sVar6 = cmsys::RegularExpression::end((RegularExpression *)&regexString);
        uVar7 = std::__cxx11::string::size();
        if (sVar6 < uVar7) {
          cmsys::RegularExpression::end((RegularExpression *)&regexString);
          std::__cxx11::string::substr((ulong)((long)&makefileName.field_2 + 8),(ulong)local_298);
          std::__cxx11::string::operator=
                    ((string *)local_298,(string *)(makefileName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
        }
        else {
          std::__cxx11::string::operator=((string *)local_298,"");
        }
      }
      std::__cxx11::string::~string((string *)local_298);
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&regexString);
      std::__cxx11::string::~string((string *)&flagRegex.searchstring);
      std::__cxx11::string::~string((string *)(definesString.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&local_c8);
    }
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_58);
  }
  std::__cxx11::string::string(local_320);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_340);
  bVar1 = std::operator==(&local_340,"Ninja");
  std::__cxx11::string::~string((string *)&local_340);
  if (bVar1) {
    std::__cxx11::string::operator=(local_320,"build.ninja");
  }
  else {
    std::__cxx11::string::operator=(local_320,"Makefile");
  }
  if ((sourceFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::operator<<((ostream *)fout,",\n\t");
  }
  poVar8 = std::operator<<((ostream *)fout,"\t{\n\t\t\t\"name\": \"");
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_360,lg);
  poVar8 = std::operator<<(poVar8,(string *)&local_360);
  poVar8 = std::operator<<(poVar8," - ");
  poVar8 = std::operator<<(poVar8,(string *)targetName);
  std::operator<<(poVar8,"\",\n");
  std::__cxx11::string::~string((string *)&local_360);
  poVar8 = std::operator<<((ostream *)fout,"\t\t\t\"cmd\": [");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3a0,make,&local_3a1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  BuildMakeCommand(&local_380,this,&local_3a0,pcVar2,targetName);
  poVar8 = std::operator<<(poVar8,(string *)&local_380);
  std::operator<<(poVar8,"],\n");
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  std::operator<<((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n");
  std::operator<<((ostream *)fout,
                  "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
                 );
  std::operator<<((ostream *)fout,"\t\t}");
  std::__cxx11::string::~string(local_320);
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != CM_NULLPTR) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    std::vector<cmSourceFile*>::const_iterator sourceFilesEnd =
      sourceFiles.end();
    for (std::vector<cmSourceFile*>::const_iterator iter = sourceFiles.begin();
         iter != sourceFilesEnd; ++iter) {
      cmSourceFile* sourceFile = *iter;
      MapSourceFileFlags::iterator sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->GetFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(sourceFile->GetFullPath(),
                                                   std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString = this->ComputeFlagsForObject(*iter, lg, target);
      std::string definesString = this->ComputeDefines(*iter, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?";
      flagRegex.compile(regexString);
      std::string workString = flagsString + " " + definesString;
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString = "";
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
       << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}